

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg-ndfs.cc
# Opt level: O0

bool __thiscall
tchecker::tck_liveness::zg_ndfs::edge_lexical_less_t::operator()
          (edge_lexical_less_t *this,edge_sptr_t *e1,edge_sptr_t *e2)

{
  int iVar1;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  vedge_t *vedge1;
  vedge_t *vedge2;
  edge_sptr_t *e2_local;
  edge_sptr_t *e1_local;
  edge_lexical_less_t *this_local;
  
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(e1);
  vedge1 = tchecker::graph::edge_vedge_t::vedge((edge_vedge_t *)pmVar2);
  pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
           ::operator->(e2);
  vedge2 = tchecker::graph::edge_vedge_t::vedge((edge_vedge_t *)pmVar2);
  iVar1 = tchecker::lexical_cmp(vedge1,vedge2);
  return iVar1 < 0;
}

Assistant:

bool operator()(tchecker::tck_liveness::zg_ndfs::graph_t::edge_sptr_t const & e1,
                  tchecker::tck_liveness::zg_ndfs::graph_t::edge_sptr_t const & e2) const
  {
    return tchecker::lexical_cmp(e1->vedge(), e2->vedge()) < 0;
  }